

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O3

int GCPtr<symbols::ErrorObject>::shutdown(int __fd,int __how)

{
  bool bVar1;
  int in_EAX;
  _List_node_base *p_Var2;
  undefined7 extraout_var;
  int iVar3;
  list<GCInfo<symbols::ErrorObject>,_std::allocator<GCInfo<symbols::ErrorObject>_>_> *plVar4;
  
  if ((int)gclist_abi_cxx11_.
           super__List_base<GCInfo<symbols::ErrorObject>,_std::allocator<GCInfo<symbols::ErrorObject>_>_>
           ._M_impl._M_node._M_size == 0) {
    return in_EAX;
  }
  p_Var2 = gclist_abi_cxx11_.
           super__List_base<GCInfo<symbols::ErrorObject>,_std::allocator<GCInfo<symbols::ErrorObject>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (gclist_abi_cxx11_.
      super__List_base<GCInfo<symbols::ErrorObject>,_std::allocator<GCInfo<symbols::ErrorObject>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&gclist_abi_cxx11_) {
    do {
      *(undefined4 *)&p_Var2[1]._M_next = 0;
      p_Var2 = (((_List_base<GCInfo<symbols::ErrorObject>,_std::allocator<GCInfo<symbols::ErrorObject>_>_>
                  *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var2 != (_List_node_base *)&gclist_abi_cxx11_);
    bVar1 = collect();
    return (int)CONCAT71(extraout_var,bVar1);
  }
  iVar3 = 0;
  do {
    plVar4 = &gclist_abi_cxx11_;
    do {
      plVar4 = (list<GCInfo<symbols::ErrorObject>,_std::allocator<GCInfo<symbols::ErrorObject>_>_> *
               )(plVar4->
                super__List_base<GCInfo<symbols::ErrorObject>,_std::allocator<GCInfo<symbols::ErrorObject>_>_>
                )._M_impl._M_node.super__List_node_base._M_next;
      if (plVar4 == &gclist_abi_cxx11_) {
        return iVar3;
      }
    } while (*(int *)((long)plVar4 + 0x10) != 0);
    std::__cxx11::list<GCInfo<symbols::ErrorObject>,_std::allocator<GCInfo<symbols::ErrorObject>_>_>
    ::remove(&gclist_abi_cxx11_,(char *)((long)plVar4 + 0x10));
    iVar3 = 1;
    if (*(_List_node_base **)((long)plVar4 + 0x10U + 8) != (_List_node_base *)0x0) {
      (**(code **)((long)(*(_List_node_base **)((long)plVar4 + 0x10U + 8))->_M_next + 0x10))();
    }
  } while( true );
}

Assistant:

void GCPtr<T>::shutdown() {
    if(gclistSize() == 0) return ; // list is empty

    typename list<GCInfo<T>>::iterator p;

    for(p = gclist.begin(); p != gclist.end(); p++){
        // Set all reference counts to zero
        p->refcount = 0;
    }
    #ifdef DISPLAY
    cout << "Before collecting for shutdown() for "
    << typeid(T).name() << "\n";
    #endif

    collect();

    #ifdef DISPLAY
    cout << "After collecting for shutdown() for "
    << typeid(T).name() << "\n";
    #endif


}